

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void rgb_rgb_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                    JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  JSAMPROW pJVar5;
  bool bVar6;
  ulong uVar7;
  JSAMPLE *pJVar8;
  
  switch(cinfo->in_color_space) {
  case JCS_EXT_RGB:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar8 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = *pJVar8;
            pJVar4[uVar7] = pJVar8[1];
            pJVar5[uVar7] = pJVar8[2];
            pJVar8 = pJVar8 + 3;
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = pJVar2[uVar7 * 4];
            pJVar4[uVar7] = pJVar2[uVar7 * 4 + 1];
            pJVar5[uVar7] = pJVar2[uVar7 * 4 + 2];
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  case JCS_EXT_BGR:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar8 = *input_buf + 2;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = *pJVar8;
            pJVar4[uVar7] = pJVar8[-1];
            pJVar5[uVar7] = pJVar8[-2];
            uVar7 = uVar7 + 1;
            pJVar8 = pJVar8 + 3;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = pJVar2[uVar7 * 4 + 2];
            pJVar4[uVar7] = pJVar2[uVar7 * 4 + 1];
            pJVar5[uVar7] = pJVar2[uVar7 * 4];
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = pJVar2[uVar7 * 4 + 3];
            pJVar4[uVar7] = pJVar2[uVar7 * 4 + 2];
            pJVar5[uVar7] = pJVar2[uVar7 * 4 + 1];
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar2 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = pJVar2[uVar7 * 4 + 1];
            pJVar4[uVar7] = pJVar2[uVar7 * 4 + 2];
            pJVar5[uVar7] = pJVar2[uVar7 * 4 + 3];
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
    break;
  default:
    if (0 < num_rows) {
      uVar1 = cinfo->image_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar3 = (*output_buf)[output_row];
          pJVar4 = output_buf[1][output_row];
          pJVar5 = output_buf[2][output_row];
          pJVar8 = *input_buf;
          uVar7 = 0;
          do {
            pJVar3[uVar7] = *pJVar8;
            pJVar4[uVar7] = pJVar8[1];
            pJVar5[uVar7] = pJVar8[2];
            pJVar8 = pJVar8 + 3;
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
        }
        input_buf = input_buf + 1;
        output_row = output_row + 1;
        bVar6 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar6);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}